

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

istream * amrex::operator>>(istream *is,CoordSys *c)

{
  void *pvVar1;
  int *in_RSI;
  istream *in_RDI;
  istream *this;
  Real RVar2;
  int k;
  int tmp;
  Real cellsize [3];
  int coord;
  int local_40;
  int local_3c;
  double local_38 [4];
  int local_14;
  int *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar1 = (void *)std::istream::ignore((long)in_RDI,100000);
  std::istream::operator>>(pvVar1,&local_14);
  *local_10 = local_14;
  pvVar1 = (void *)std::istream::ignore((long)local_8,100000);
  std::istream::operator>>(pvVar1,(double *)(local_10 + 2));
  pvVar1 = (void *)std::istream::ignore((long)local_8,100000);
  std::istream::operator>>(pvVar1,(double *)(local_10 + 4));
  pvVar1 = (void *)std::istream::ignore((long)local_8,100000);
  std::istream::operator>>(pvVar1,(double *)(local_10 + 6));
  std::istream::ignore((long)local_8,100000);
  pvVar1 = (void *)std::istream::ignore((long)local_8,100000);
  std::istream::operator>>(pvVar1,local_38);
  pvVar1 = (void *)std::istream::ignore((long)local_8,100000);
  std::istream::operator>>(pvVar1,local_38 + 1);
  pvVar1 = (void *)std::istream::ignore((long)local_8,100000);
  std::istream::operator>>(pvVar1,local_38 + 2);
  std::istream::ignore((long)local_8,100000);
  std::istream::operator>>(local_8,&local_3c);
  *(byte *)(local_10 + 0x14) = -(local_3c != 0) & 1;
  this = local_8;
  std::istream::ignore((long)local_8,100000);
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    *(double *)(local_10 + (long)local_40 * 2 + 8) = local_38[local_40];
    RVar2 = literals::operator____rt((literals *)this,(longdouble)1);
    *(double *)(local_10 + (long)local_40 * 2 + 0xe) = RVar2 / local_38[local_40];
  }
  return local_8;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            CoordSys&     c)
{
    int coord;
    is.ignore(BL_IGNORE_MAX, '(') >> coord;
    c.c_sys = (CoordSys::CoordType) coord;
    AMREX_D_EXPR(is.ignore(BL_IGNORE_MAX, '(') >> c.offset[0],
                 is.ignore(BL_IGNORE_MAX, ',') >> c.offset[1],
                 is.ignore(BL_IGNORE_MAX, ',') >> c.offset[2]);
    is.ignore(BL_IGNORE_MAX, ')');
    Real cellsize[3];
    AMREX_D_EXPR(is.ignore(BL_IGNORE_MAX, '(') >> cellsize[0],
                 is.ignore(BL_IGNORE_MAX, ',') >> cellsize[1],
                 is.ignore(BL_IGNORE_MAX, ',') >> cellsize[2]);
    is.ignore(BL_IGNORE_MAX, ')');
    int tmp;
    is >> tmp;
    c.ok = tmp?true:false;
    is.ignore(BL_IGNORE_MAX, '\n');
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        c.dx[k] = cellsize[k];
        c.inv_dx[k] = 1.0_rt/cellsize[k];
    }
    return is;
}